

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O0

void interpolate_core(uint8_t *input,int in_length,uint8_t *output,int out_length,
                     int16_t *interp_filters,int interp_taps)

{
  int iVar1;
  int iVar2;
  uint8_t uVar3;
  uint uVar4;
  uint in_ECX;
  uint8_t *in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  int16_t *filter_3;
  int16_t *filter_2;
  int16_t *filter_1;
  int pk;
  int16_t *filter;
  int32_t y;
  int sub_pel;
  int int_pel;
  int k;
  int sum;
  int x2;
  int x1;
  int x;
  uint8_t *optr;
  int32_t offset;
  int32_t delta;
  int local_f0;
  int local_d0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_90;
  int local_60;
  int local_54;
  int local_50;
  int local_44;
  uint8_t *local_40;
  
  uVar4 = (uint)(in_ESI * 0x4000 + (int)in_ECX / 2) / in_ECX;
  if ((int)in_ECX < in_ESI) {
    local_90 = (in_ESI - in_ECX) * 0x2000 + (int)in_ECX / 2;
  }
  else {
    local_90 = -((in_ECX - in_ESI) * 0x2000 + (int)in_ECX / 2);
  }
  local_90 = local_90 / (int)in_ECX;
  local_44 = 0;
  for (local_60 = local_90 + 0x80; iVar1 = local_44, local_60 >> 0xe < in_R9D / 2 + -1;
      local_60 = uVar4 + local_60) {
    local_44 = local_44 + 1;
  }
  local_44 = in_ECX - 1;
  for (local_60 = uVar4 * local_44 + local_90 + 0x80; iVar2 = local_44,
      in_ESI <= (local_60 >> 0xe) + in_R9D / 2; local_60 = local_60 - uVar4) {
    local_44 = local_44 + -1;
  }
  if (local_44 < iVar1) {
    local_60 = local_90 + 0x80;
    local_40 = in_RDX;
    for (local_44 = 0; local_44 < (int)in_ECX; local_44 = local_44 + 1) {
      local_50 = 0;
      for (local_54 = 0; local_54 < in_R9D; local_54 = local_54 + 1) {
        local_b8 = ((local_60 >> 0xe) - in_R9D / 2) + 1 + local_54;
        local_b4 = local_b8;
        if (in_ESI + -1 <= local_b8) {
          local_b4 = in_ESI + -1;
        }
        if (local_b4 < 1) {
          local_bc = 0;
        }
        else {
          if (in_ESI + -1 <= local_b8) {
            local_b8 = in_ESI + -1;
          }
          local_bc = local_b8;
        }
        local_50 = (int)*(short *)(in_R8 + (long)(int)((local_60 >> 8 & 0x3fU) * in_R9D) * 2 +
                                  (long)local_54 * 2) * (uint)*(byte *)(in_RDI + local_bc) +
                   local_50;
      }
      uVar3 = clip_pixel(local_50 + 0x40 >> 7);
      *local_40 = uVar3;
      local_60 = uVar4 + local_60;
      local_40 = local_40 + 1;
    }
  }
  else {
    local_60 = local_90 + 0x80;
    local_40 = in_RDX;
    for (local_44 = 0; local_44 < iVar1; local_44 = local_44 + 1) {
      local_50 = 0;
      for (local_54 = 0; local_54 < in_R9D; local_54 = local_54 + 1) {
        if (((local_60 >> 0xe) - in_R9D / 2) + 1 + local_54 < 1) {
          local_d0 = 0;
        }
        else {
          local_d0 = ((local_60 >> 0xe) - in_R9D / 2) + 1 + local_54;
        }
        local_50 = (int)*(short *)(in_R8 + (long)(int)((local_60 >> 8 & 0x3fU) * in_R9D) * 2 +
                                  (long)local_54 * 2) * (uint)*(byte *)(in_RDI + local_d0) +
                   local_50;
      }
      uVar3 = clip_pixel(local_50 + 0x40 >> 7);
      *local_40 = uVar3;
      local_60 = uVar4 + local_60;
      local_40 = local_40 + 1;
    }
    for (; local_44 <= iVar2; local_44 = local_44 + 1) {
      local_50 = 0;
      for (local_54 = 0; local_54 < in_R9D; local_54 = local_54 + 1) {
        local_50 = (int)*(short *)(in_R8 + (long)(int)((local_60 >> 8 & 0x3fU) * in_R9D) * 2 +
                                  (long)local_54 * 2) *
                   (uint)*(byte *)(in_RDI + (((local_60 >> 0xe) - in_R9D / 2) + 1 + local_54)) +
                   local_50;
      }
      uVar3 = clip_pixel(local_50 + 0x40 >> 7);
      *local_40 = uVar3;
      local_60 = uVar4 + local_60;
      local_40 = local_40 + 1;
    }
    for (; local_44 < (int)in_ECX; local_44 = local_44 + 1) {
      local_50 = 0;
      for (local_54 = 0; local_54 < in_R9D; local_54 = local_54 + 1) {
        if (((local_60 >> 0xe) - in_R9D / 2) + 1 + local_54 < in_ESI + -1) {
          local_f0 = ((local_60 >> 0xe) - in_R9D / 2) + 1 + local_54;
        }
        else {
          local_f0 = in_ESI + -1;
        }
        local_50 = (int)*(short *)(in_R8 + (long)(int)((local_60 >> 8 & 0x3fU) * in_R9D) * 2 +
                                  (long)local_54 * 2) * (uint)*(byte *)(in_RDI + local_f0) +
                   local_50;
      }
      uVar3 = clip_pixel(local_50 + 0x40 >> 7);
      *local_40 = uVar3;
      local_60 = uVar4 + local_60;
      local_40 = local_40 + 1;
    }
  }
  return;
}

Assistant:

static void interpolate_core(const uint8_t *const input, int in_length,
                             uint8_t *output, int out_length,
                             const int16_t *interp_filters, int interp_taps) {
  const int32_t delta =
      (((uint32_t)in_length << RS_SCALE_SUBPEL_BITS) + out_length / 2) /
      out_length;
  const int32_t offset =
      in_length > out_length
          ? (((int32_t)(in_length - out_length) << (RS_SCALE_SUBPEL_BITS - 1)) +
             out_length / 2) /
                out_length
          : -(((int32_t)(out_length - in_length)
               << (RS_SCALE_SUBPEL_BITS - 1)) +
              out_length / 2) /
                out_length;
  uint8_t *optr = output;
  int x, x1, x2, sum, k, int_pel, sub_pel;
  int32_t y;

  x = 0;
  y = offset + RS_SCALE_EXTRA_OFF;
  while ((y >> RS_SCALE_SUBPEL_BITS) < (interp_taps / 2 - 1)) {
    x++;
    y += delta;
  }
  x1 = x;
  x = out_length - 1;
  y = delta * x + offset + RS_SCALE_EXTRA_OFF;
  while ((y >> RS_SCALE_SUBPEL_BITS) + (int32_t)(interp_taps / 2) >=
         in_length) {
    x--;
    y -= delta;
  }
  x2 = x;
  if (x1 > x2) {
    for (x = 0, y = offset + RS_SCALE_EXTRA_OFF; x < out_length;
         ++x, y += delta) {
      int_pel = y >> RS_SCALE_SUBPEL_BITS;
      sub_pel = (y >> RS_SCALE_EXTRA_BITS) & RS_SUBPEL_MASK;
      const int16_t *filter = &interp_filters[sub_pel * interp_taps];
      sum = 0;
      for (k = 0; k < interp_taps; ++k) {
        const int pk = int_pel - interp_taps / 2 + 1 + k;
        sum += filter[k] * input[AOMMAX(AOMMIN(pk, in_length - 1), 0)];
      }
      *optr++ = clip_pixel(ROUND_POWER_OF_TWO(sum, FILTER_BITS));
    }
  } else {
    // Initial part.
    for (x = 0, y = offset + RS_SCALE_EXTRA_OFF; x < x1; ++x, y += delta) {
      int_pel = y >> RS_SCALE_SUBPEL_BITS;
      sub_pel = (y >> RS_SCALE_EXTRA_BITS) & RS_SUBPEL_MASK;
      const int16_t *filter = &interp_filters[sub_pel * interp_taps];
      sum = 0;
      for (k = 0; k < interp_taps; ++k)
        sum += filter[k] * input[AOMMAX(int_pel - interp_taps / 2 + 1 + k, 0)];
      *optr++ = clip_pixel(ROUND_POWER_OF_TWO(sum, FILTER_BITS));
    }
    // Middle part.
    for (; x <= x2; ++x, y += delta) {
      int_pel = y >> RS_SCALE_SUBPEL_BITS;
      sub_pel = (y >> RS_SCALE_EXTRA_BITS) & RS_SUBPEL_MASK;
      const int16_t *filter = &interp_filters[sub_pel * interp_taps];
      sum = 0;
      for (k = 0; k < interp_taps; ++k)
        sum += filter[k] * input[int_pel - interp_taps / 2 + 1 + k];
      *optr++ = clip_pixel(ROUND_POWER_OF_TWO(sum, FILTER_BITS));
    }
    // End part.
    for (; x < out_length; ++x, y += delta) {
      int_pel = y >> RS_SCALE_SUBPEL_BITS;
      sub_pel = (y >> RS_SCALE_EXTRA_BITS) & RS_SUBPEL_MASK;
      const int16_t *filter = &interp_filters[sub_pel * interp_taps];
      sum = 0;
      for (k = 0; k < interp_taps; ++k)
        sum += filter[k] *
               input[AOMMIN(int_pel - interp_taps / 2 + 1 + k, in_length - 1)];
      *optr++ = clip_pixel(ROUND_POWER_OF_TWO(sum, FILTER_BITS));
    }
  }
}